

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

void AimBulletMissile(AActor *proj,AActor *puff,int flags,bool temp,bool cba)

{
  AActor *this;
  TAngle<double> local_48;
  TAngle<double> local_40;
  TAngle<double> local_38;
  TAngle<double> local_30;
  TAngle<double> local_28;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  bool cba_local;
  bool temp_local;
  AActor *pAStack_18;
  int flags_local;
  AActor *puff_local;
  AActor *proj_local;
  
  local_1e = cba;
  local_1d = temp;
  local_1c = flags;
  pAStack_18 = puff;
  puff_local = proj;
  if (((proj != (AActor *)0x0) && (puff != (AActor *)0x0)) && (proj != (AActor *)0x0)) {
    TAngle<double>::TAngle(&local_28,0.0);
    TAngle<double>::TAngle(&local_30,0.0);
    TAngle<double>::TAngle(&local_38,0.0);
    TAngle<double>::TAngle(&local_40,0.0);
    A_Face(proj,puff,&local_28,&local_30,&local_38,&local_40,1,0.0);
    this = puff_local;
    TAngle<double>::TAngle(&local_48,&(puff_local->Angles).Pitch);
    AActor::Vel3DFromAngle(this,&local_48,puff_local->Speed);
    if ((local_1d & 1) == 0) {
      if ((local_1e & 1) == 0) {
        if ((local_1c & 0x40) != 0) {
          TObjPtr<AActor>::operator=(&puff_local->target,pAStack_18);
        }
        if ((local_1c & 0x80) != 0) {
          TObjPtr<AActor>::operator=(&puff_local->master,pAStack_18);
        }
        if ((local_1c & 0x100) != 0) {
          TObjPtr<AActor>::operator=(&puff_local->tracer,pAStack_18);
        }
      }
      else {
        if ((local_1c & 0x20) != 0) {
          TObjPtr<AActor>::operator=(&puff_local->target,pAStack_18);
        }
        if ((local_1c & 0x40) != 0) {
          TObjPtr<AActor>::operator=(&puff_local->master,pAStack_18);
        }
        if ((local_1c & 0x80) != 0) {
          TObjPtr<AActor>::operator=(&puff_local->tracer,pAStack_18);
        }
      }
    }
  }
  if ((pAStack_18 != (AActor *)0x0) && ((local_1d & 1) != 0)) {
    (*(pAStack_18->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  return;
}

Assistant:

static void AimBulletMissile(AActor *proj, AActor *puff, int flags, bool temp, bool cba)
{
	if (proj && puff)
	{
		if (proj)
		{
			// FAF_BOTTOM = 1
			// Aim for the base of the puff as that's where blood puffs will spawn... roughly.

			A_Face(proj, puff, 0., 0., 0., 0., 1);
			proj->Vel3DFromAngle(proj->Angles.Pitch, proj->Speed);

			if (!temp)
			{
				if (cba)
				{
					if (flags & CBAF_PUFFTARGET)	proj->target = puff;
					if (flags & CBAF_PUFFMASTER)	proj->master = puff;
					if (flags & CBAF_PUFFTRACER)	proj->tracer = puff;
				}
				else
				{
					if (flags & FBF_PUFFTARGET)	proj->target = puff;
					if (flags & FBF_PUFFMASTER)	proj->master = puff;
					if (flags & FBF_PUFFTRACER)	proj->tracer = puff;
				}
			}
		}
	}
	if (puff && temp)
	{
		puff->Destroy();
	}
}